

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

SQRESULT sq_deleteslot(HSQUIRRELVM v,SQInteger idx,SQBool pushval)

{
  bool bVar1;
  SQObjectPtr *pSVar2;
  SQRESULT SVar3;
  SQObjectPtr res;
  SQObjectPtr *self;
  
  if (v->_top - v->_stackbase < 2) {
    SQVM::Raise_Error(v,"not enough params in the stack");
  }
  else {
    bVar1 = sq_aux_gettypedarg(v,idx,OT_TABLE,&self);
    if (bVar1) {
      SVar3 = -1;
      pSVar2 = SQVM::GetUp(v,-1);
      if ((pSVar2->super_SQObject)._type != OT_NULL) {
        res.super_SQObject._type = OT_NULL;
        res.super_SQObject._unVal.pTable = (SQTable *)0x0;
        bVar1 = SQVM::DeleteSlot(v,self,pSVar2,&res);
        if (bVar1) {
          if (pushval == 0) {
            SQVM::Pop(v);
          }
          else {
            pSVar2 = SQVM::GetUp(v,-1);
            SQObjectPtr::operator=(pSVar2,&res);
          }
          SVar3 = 0;
        }
        else {
          SQVM::Pop(v);
        }
        SQObjectPtr::~SQObjectPtr(&res);
        return SVar3;
      }
      sq_throwerror(v,"null is not a valid key");
    }
  }
  return -1;
}

Assistant:

SQRESULT sq_deleteslot(HSQUIRRELVM v,SQInteger idx,SQBool pushval)
{
    sq_aux_paramscheck(v, 2);
    SQObjectPtr *self;
    _GETSAFE_OBJ(v, idx, OT_TABLE,self);
    SQObjectPtr &key = v->GetUp(-1);
    if(sq_type(key) == OT_NULL) return sq_throwerror(v, _SC("null is not a valid key"));
    SQObjectPtr res;
    if(!v->DeleteSlot(*self, key, res)){
        v->Pop();
        return SQ_ERROR;
    }
    if(pushval) v->GetUp(-1) = res;
    else v->Pop();
    return SQ_OK;
}